

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall QtMWidgets::MsgBoxTitle::paintEvent(MsgBoxTitle *this,QPaintEvent *param_1)

{
  int aleft;
  QFlags<Qt::AlignmentFlag> QVar1;
  QPalette *this_00;
  MsgBoxTitlePrivate *pMVar2;
  QScopedPointer<QtMWidgets::MsgBoxTitlePrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxTitlePrivate>_>
  *this_01;
  QTextOption local_98 [24];
  QMargins local_80;
  QRect local_70;
  QRect local_60;
  QRectF local_50;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  MsgBoxTitle *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  this_00 = (QPalette *)QWidget::palette();
  QPalette::color(this_00,WindowText);
  QPainter::setPen((QColor *)local_20);
  local_70 = QWidget::rect(&this->super_QWidget);
  this_01 = &this->d;
  pMVar2 = QScopedPointer<QtMWidgets::MsgBoxTitlePrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxTitlePrivate>_>
           ::operator->(this_01);
  aleft = pMVar2->margin;
  pMVar2 = QScopedPointer<QtMWidgets::MsgBoxTitlePrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxTitlePrivate>_>
           ::operator->(this_01);
  QMargins::QMargins(&local_80,aleft,0,pMVar2->margin,0);
  local_60 = QRect::marginsRemoved(&local_70,&local_80);
  QRectF::QRectF(&local_50,&local_60);
  pMVar2 = QScopedPointer<QtMWidgets::MsgBoxTitlePrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxTitlePrivate>_>
           ::operator->(this_01);
  QVar1 = Qt::operator|(AlignLeading,AlignVCenter);
  QTextOption::QTextOption(local_98,(QFlags_conflict1 *)(ulong)QVar1.i);
  QPainter::drawText((QRectF *)local_20,(QString *)&local_50,(QTextOption *)&pMVar2->preparedTitle);
  QTextOption::~QTextOption(local_98);
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void paintEvent( QPaintEvent * ) override
	{
		QPainter p( this );

		p.setPen( palette().color( QPalette::WindowText ) );

		p.drawText( rect().marginsRemoved( QMargins( d->margin, 0,
				d->margin, 0 ) ),
			d->preparedTitle, QTextOption( Qt::AlignLeft | Qt::AlignVCenter ) );
	}